

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

dxil_spv_result
dxil_spv_parsed_blob_get_entry_point_node_output
          (dxil_spv_parsed_blob blob,uint index,uint output_index,dxil_spv_node_output_data *data)

{
  size_type sVar1;
  reference pvVar2;
  reference this;
  char *pcVar3;
  value_type *output;
  value_type *entry;
  dxil_spv_node_output_data *data_local;
  uint output_index_local;
  uint index_local;
  dxil_spv_parsed_blob blob_local;
  
  sVar1 = std::
          vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
          ::size(&blob->entry_points);
  if (index < sVar1) {
    pvVar2 = std::
             vector<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
             ::operator[](&blob->entry_points,(ulong)index);
    sVar1 = std::
            vector<dxil_spv::NodeOutputData,_dxil_spv::ThreadLocalAllocator<dxil_spv::NodeOutputData>_>
            ::size(&pvVar2->node_outputs);
    if (output_index < sVar1) {
      this = std::
             vector<dxil_spv::NodeOutputData,_dxil_spv::ThreadLocalAllocator<dxil_spv::NodeOutputData>_>
             ::operator[](&pvVar2->node_outputs,(ulong)output_index);
      pcVar3 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
               c_str(&this->node_id);
      data->node_id = pcVar3;
      data->node_array_index = this->node_array_index;
      data->node_array_size = this->node_array_size;
      data->sparse_array = this->sparse_array & 1;
      data->max_records = this->max_records;
      data->node_index_spec_constant_id = this->node_index_spec_constant_id;
      blob_local._4_4_ = DXIL_SPV_SUCCESS;
    }
    else {
      blob_local._4_4_ = DXIL_SPV_ERROR_INVALID_ARGUMENT;
    }
  }
  else {
    blob_local._4_4_ = DXIL_SPV_ERROR_INVALID_ARGUMENT;
  }
  return blob_local._4_4_;
}

Assistant:

dxil_spv_result dxil_spv_parsed_blob_get_entry_point_node_output(
    dxil_spv_parsed_blob blob, unsigned index, unsigned output_index, dxil_spv_node_output_data *data)
{
	if (index >= blob->entry_points.size())
		return DXIL_SPV_ERROR_INVALID_ARGUMENT;

	auto &entry = blob->entry_points[index];
	if (output_index >= entry.node_outputs.size())
		return DXIL_SPV_ERROR_INVALID_ARGUMENT;

	auto &output = entry.node_outputs[output_index];

	data->node_id = output.node_id.c_str();
	data->node_array_index = output.node_array_index;
	data->node_array_size = output.node_array_size;
	data->sparse_array = output.sparse_array;
	data->max_records = output.max_records;
	data->node_index_spec_constant_id = output.node_index_spec_constant_id;

	return DXIL_SPV_SUCCESS;
}